

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::Identification::Copy(Identification *this,Identification *rhs)

{
  Identification *rhs_local;
  Identification *this_local;
  
  InterchangeObject::Copy(&this->super_InterchangeObject,&rhs->super_InterchangeObject);
  Kumu::UUID::operator=(&this->ThisGenerationUID,&rhs->ThisGenerationUID);
  UTF16String::operator=(&this->CompanyName,&rhs->CompanyName);
  UTF16String::operator=(&this->ProductName,&rhs->ProductName);
  VersionType::operator=(&this->ProductVersion,&rhs->ProductVersion);
  UTF16String::operator=(&this->VersionString,&rhs->VersionString);
  Kumu::UUID::operator=(&this->ProductUID,&rhs->ProductUID);
  Kumu::Timestamp::operator=(&this->ModificationDate,&rhs->ModificationDate);
  VersionType::operator=(&this->ToolkitVersion,&rhs->ToolkitVersion);
  optional_property<ASDCP::MXF::UTF16String>::operator=(&this->Platform,&rhs->Platform);
  return;
}

Assistant:

void
Identification::Copy(const Identification& rhs)
{
  InterchangeObject::Copy(rhs);
  ThisGenerationUID = rhs.ThisGenerationUID;
  CompanyName = rhs.CompanyName;
  ProductName = rhs.ProductName;
  ProductVersion = rhs.ProductVersion;
  VersionString = rhs.VersionString;
  ProductUID = rhs.ProductUID;
  ModificationDate = rhs.ModificationDate;
  ToolkitVersion = rhs.ToolkitVersion;
  Platform = rhs.Platform;
}